

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool __thiscall
cmInstallCommand::HandleDirectoryMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  MessageLevel message;
  undefined8 uVar5;
  size_type sVar6;
  const_iterator cVar7;
  cmInstallDirectoryGenerator *this_01;
  cmGlobalGenerator *this_02;
  ostream *poVar8;
  byte bVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  pointer pbVar13;
  string *psVar14;
  _Alloc_hider dest;
  ulong uVar15;
  string destinationStr;
  string permissions_file;
  string local_290;
  string literal_args;
  bool local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [6];
  ios_base local_1c0 [264];
  pointer local_b8;
  undefined8 local_b0;
  string component;
  string type;
  string permissions_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  permissions_file._M_dataplus._M_p = (pointer)&permissions_file.field_2;
  permissions_file._M_string_length = 0;
  permissions_file.field_2._M_local_buf[0] = '\0';
  permissions_dir._M_dataplus._M_p = (pointer)&permissions_dir.field_2;
  permissions_dir._M_string_length = 0;
  permissions_dir.field_2._M_local_buf[0] = '\0';
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  component._M_dataplus._M_p = (pointer)&component.field_2;
  pcVar1 = (this->DefaultComponentName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&component,pcVar1,pcVar1 + (this->DefaultComponentName)._M_string_length);
  literal_args._M_dataplus._M_p = (pointer)&literal_args.field_2;
  bVar10 = false;
  literal_args._M_string_length = 0;
  literal_args.field_2._M_local_buf[0] = '\0';
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type._M_string_length = 0;
  type.field_2._M_local_buf[0] = '\0';
  pbVar13 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar9 = 0;
  local_250 = false;
  dest._M_p = (pointer)0x0;
  if (0x20 < (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13)) {
    iVar12 = 1;
    uVar15 = 1;
    uVar11 = 2;
    local_b8 = (pointer)0x0;
    local_250 = false;
    local_b0 = 0;
    bVar10 = false;
    bVar2 = false;
    do {
      iVar4 = std::__cxx11::string::compare((char *)(pbVar13 + uVar15));
      if (iVar4 == 0) {
        iVar12 = 2;
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," does not allow \"",0x11);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" after PATTERN or REGEX.",0x19);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_002315c6;
        }
        goto LAB_00230d58;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15));
      if (iVar4 == 0) {
        iVar12 = 10;
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," does not allow \"",0x11);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" after PATTERN or REGEX.",0x19);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_002315c6;
        }
        goto LAB_00230d58;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15));
      if (iVar4 == 0) {
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," does not allow \"",0x11);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" after PATTERN or REGEX.",0x19);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_002315c6;
        }
        iVar12 = 0;
        bVar10 = true;
        goto LAB_00230d58;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15));
      if (iVar4 == 0) {
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," does not allow \"",0x11);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" after PATTERN or REGEX.",0x19);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_002315c6;
        }
        iVar12 = 0;
        local_250 = true;
        goto LAB_00230d58;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15));
      if (iVar4 == 0) {
        iVar12 = 3;
LAB_00230ce7:
        bVar2 = true;
        goto LAB_00230d58;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15));
      if (iVar4 == 0) {
        iVar12 = 4;
        goto LAB_00230ce7;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15));
      if (iVar4 == 0) {
        if ((iVar12 - 5U < 0xfffffffe) && (bVar2)) goto LAB_00230d09;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar13 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," does not allow \"",0x11);
        pbVar13 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,pbVar13[uVar15]._M_dataplus._M_p,pbVar13[uVar15]._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"\" before a PATTERN or REGEX is given.",0x25);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
          operator_delete(destinationStr._M_dataplus._M_p,
                          CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                   destinationStr.field_2._M_local_buf[0]) + 1);
        }
LAB_002315c6:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::ios_base::~ios_base(local_1c0);
        bVar10 = false;
        goto LAB_002315e9;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15));
      if (iVar4 == 0) {
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," does not allow \"",0x11);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" before a PATTERN or REGEX is given.",0x25);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_002315c6;
        }
        iVar12 = 7;
        std::__cxx11::string::append((char *)&literal_args);
        goto LAB_00230d58;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15));
      if (iVar4 == 0) {
        iVar12 = 5;
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," does not allow \"",0x11);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" after PATTERN or REGEX.",0x19);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_002315c6;
        }
        goto LAB_00230d58;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15));
      if (iVar4 == 0) {
        iVar12 = 6;
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," does not allow \"",0x11);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" after PATTERN or REGEX.",0x19);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_002315c6;
        }
        goto LAB_00230d58;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15));
      if (iVar4 == 0) {
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," does not allow \"",0x11);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" after PATTERN or REGEX.",0x19);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_002315c6;
        }
LAB_00230d09:
        std::__cxx11::string::append((char *)&literal_args);
        goto LAB_00230d13;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15));
      if (iVar4 == 0) {
        if (!bVar2) goto LAB_00230d09;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar13 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," does not allow \"",0x11);
        pbVar13 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,pbVar13[uVar15]._M_dataplus._M_p,pbVar13[uVar15]._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" after PATTERN or REGEX.",0x19)
        ;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
          operator_delete(destinationStr._M_dataplus._M_p,
                          CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                   destinationStr.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_002315c6;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15));
      if (iVar4 == 0) {
        iVar12 = 8;
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," does not allow \"",0x11);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" after PATTERN or REGEX.",0x19);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_002315c6;
        }
        goto LAB_00230d58;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15));
      if (iVar4 == 0) {
        iVar12 = 9;
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," does not allow \"",0x11);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" after PATTERN or REGEX.",0x19);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_002315c6;
        }
        goto LAB_00230d58;
      }
      uVar5 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15));
      if ((int)uVar5 == 0) {
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," does not allow \"",0x11);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"\" after PATTERN or REGEX.",0x19);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_002315c6;
        }
        iVar12 = 0;
        local_b0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
        goto LAB_00230d58;
      }
      if (9 < iVar12 - 1U) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar13 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," given unknown argument \"",0x19)
        ;
        pbVar13 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,pbVar13[uVar15]._M_dataplus._M_p,pbVar13[uVar15]._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&destinationStr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
          operator_delete(destinationStr._M_dataplus._M_p,
                          CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                   destinationStr.field_2._M_local_buf[0]) + 1);
        }
LAB_00231f01:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::ios_base::~ios_base(local_1c0);
LAB_00231f22:
        bVar10 = false;
        goto LAB_002315e9;
      }
      psVar14 = &component;
      switch(iVar12) {
      case 1:
        pbVar13 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        destinationStr._M_dataplus._M_p = (pointer)&destinationStr.field_2;
        pcVar1 = pbVar13[uVar15]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&destinationStr,pcVar1,pcVar1 + pbVar13[uVar15]._M_string_length);
        sVar6 = cmGeneratorExpression::Find(&destinationStr);
        if ((sVar6 != 0) && (bVar3 = cmsys::SystemTools::FileIsFullPath(&destinationStr), !bVar3)) {
          cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
          std::__cxx11::string::_M_assign((string *)&destinationStr);
          std::__cxx11::string::append((char *)&destinationStr);
          std::__cxx11::string::_M_append
                    ((char *)&destinationStr,
                     (ulong)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p);
        }
        bVar3 = cmsys::SystemTools::FileExists(&destinationStr);
        if ((bVar3) && (bVar3 = cmsys::SystemTools::FileIsDirectory(&destinationStr), !bVar3)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," given non-directory \"",0x16);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" to install.",0xd);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_290);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          std::ios_base::~ios_base(local_1c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_00231f22;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&dirs,
                   &destinationStr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
          operator_delete(destinationStr._M_dataplus._M_p,
                          CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                   destinationStr.field_2._M_local_buf[0]) + 1);
        }
        iVar12 = 1;
        break;
      case 2:
        local_b8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar15]._M_dataplus._M_p;
        goto LAB_00230d13;
      case 3:
        std::__cxx11::string::append((char *)&literal_args);
        cmsys::Glob::PatternToRegex
                  ((string *)&e,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar15,false,false);
        cmsys::SystemTools::ReplaceString((string *)&e,"\\","\\\\");
        std::__cxx11::string::_M_append((char *)&literal_args,(ulong)_e);
        std::__cxx11::string::append((char *)&literal_args);
        goto LAB_00230f2a;
      case 4:
        std::__cxx11::string::append((char *)&literal_args);
        pbVar13 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        _e = (pointer)local_220;
        pcVar1 = pbVar13[uVar15]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&e,pcVar1,pcVar1 + pbVar13[uVar15]._M_string_length);
        cmsys::SystemTools::ReplaceString((string *)&e,"\\","\\\\");
        std::__cxx11::string::_M_append((char *)&literal_args,(ulong)_e);
        std::__cxx11::string::append((char *)&literal_args);
LAB_00230f2a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_220) {
          operator_delete(_e,local_220[0]._M_allocated_capacity + 1);
        }
LAB_00230d13:
        iVar12 = 0;
        break;
      case 5:
        bVar3 = cmInstallCommandArguments::CheckPermissions
                          ((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar15,&permissions_file);
        iVar12 = 5;
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," given invalid file permission \"",0x20);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_00231f01;
        }
        break;
      case 6:
        bVar3 = cmInstallCommandArguments::CheckPermissions
                          ((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar15,&permissions_dir);
        iVar12 = 6;
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," given invalid directory permission \"",0x25);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_00231f01;
        }
        break;
      case 7:
        bVar3 = cmInstallCommandArguments::CheckPermissions
                          ((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar15,&literal_args);
        iVar12 = 7;
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8," given invalid permission \"",0x1b);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_00231f01;
        }
        break;
      case 8:
        iVar12 = 8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&configurations,
                    (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar15);
        break;
      case 9:
        goto switchD_00230bbc_caseD_9;
      case 10:
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&allowedTypes_abi_cxx11_._M_t,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar15);
        psVar14 = &type;
        if ((_Rb_tree_header *)cVar7._M_node ==
            &allowedTypes_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," given non-type \"",0x11);
          pbVar13 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,pbVar13[uVar15]._M_dataplus._M_p,
                              pbVar13[uVar15]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" with TYPE argument.",0x15);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&destinationStr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
            operator_delete(destinationStr._M_dataplus._M_p,
                            CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                                     destinationStr.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_00231f01;
        }
        goto switchD_00230bbc_caseD_9;
      }
LAB_00230d58:
      uVar15 = (ulong)uVar11;
      pbVar13 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar11 = uVar11 + 1;
    } while (uVar15 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13 >> 5
                             ));
    bVar9 = (byte)local_b0;
    dest._M_p = local_b8;
  }
  if ((dirs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       dirs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (dest._M_p != (pointer)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&dirs);
  }
  if (dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar10 = true;
    goto LAB_002315e9;
  }
  destinationStr._M_dataplus._M_p = (pointer)&destinationStr.field_2;
  destinationStr._M_string_length = 0;
  destinationStr.field_2._M_local_buf[0] = '\0';
  if (dest._M_p == (pointer)0x0) {
    if (type._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      pbVar13 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," given no DESTINATION!",0x16);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_290);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00231394;
    }
    GetDestinationForType((string *)&e,this,(cmInstallCommandArguments *)0x0,&type);
    std::__cxx11::string::operator=((string *)&destinationStr,(string *)&e);
    dest = destinationStr._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_e != local_220) {
      operator_delete(_e,local_220[0]._M_allocated_capacity + 1);
      dest = destinationStr._M_dataplus;
    }
LAB_002311ca:
    message = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,local_250);
    this_00 = (this->super_cmCommand).Makefile;
    this_01 = (cmInstallDirectoryGenerator *)operator_new(0x140);
    cmInstallDirectoryGenerator::cmInstallDirectoryGenerator
              (this_01,&dirs,dest._M_p,permissions_file._M_dataplus._M_p,
               permissions_dir._M_dataplus._M_p,&configurations,component._M_dataplus._M_p,message,
               (bool)(bVar9 & 1),literal_args._M_dataplus._M_p,bVar10);
    cmMakefile::AddInstallGenerator(this_00,(cmInstallGenerator *)this_01);
    this_02 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    bVar10 = true;
    cmGlobalGenerator::AddInstallComponent(this_02,&component);
  }
  else {
    if (type._M_string_length == 0) goto LAB_002311ca;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    pbVar13 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&e,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8," given both TYPE and DESTINATION arguments. You may only specify one.",0x45);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
LAB_00231394:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    std::ios_base::~ios_base(local_1c0);
    bVar10 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
    operator_delete(destinationStr._M_dataplus._M_p,
                    CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                             destinationStr.field_2._M_local_buf[0]) + 1);
  }
LAB_002315e9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)type._M_dataplus._M_p != &type.field_2) {
    operator_delete(type._M_dataplus._M_p,
                    CONCAT71(type.field_2._M_allocated_capacity._1_7_,type.field_2._M_local_buf[0])
                    + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)literal_args._M_dataplus._M_p != &literal_args.field_2) {
    operator_delete(literal_args._M_dataplus._M_p,
                    CONCAT71(literal_args.field_2._M_allocated_capacity._1_7_,
                             literal_args.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)component._M_dataplus._M_p != &component.field_2) {
    operator_delete(component._M_dataplus._M_p,component.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configurations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)permissions_dir._M_dataplus._M_p != &permissions_dir.field_2) {
    operator_delete(permissions_dir._M_dataplus._M_p,
                    CONCAT71(permissions_dir.field_2._M_allocated_capacity._1_7_,
                             permissions_dir.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)permissions_file._M_dataplus._M_p != &permissions_file.field_2) {
    operator_delete(permissions_file._M_dataplus._M_p,
                    CONCAT71(permissions_file.field_2._M_allocated_capacity._1_7_,
                             permissions_file.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dirs);
  return bVar10;
switchD_00230bbc_caseD_9:
  std::__cxx11::string::_M_assign((string *)psVar14);
  goto LAB_00230d13;
}

Assistant:

bool cmInstallCommand::HandleDirectoryMode(
  std::vector<std::string> const& args)
{
  enum Doing
  {
    DoingNone,
    DoingDirs,
    DoingDestination,
    DoingPattern,
    DoingRegex,
    DoingPermsFile,
    DoingPermsDir,
    DoingPermsMatch,
    DoingConfigurations,
    DoingComponent,
    DoingType
  };
  Doing doing = DoingDirs;
  bool in_match_mode = false;
  bool optional = false;
  bool exclude_from_all = false;
  bool message_never = false;
  std::vector<std::string> dirs;
  const char* destination = nullptr;
  std::string permissions_file;
  std::string permissions_dir;
  std::vector<std::string> configurations;
  std::string component = this->DefaultComponentName;
  std::string literal_args;
  std::string type;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "DESTINATION") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the destination property.
      doing = DoingDestination;
    } else if (args[i] == "TYPE") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the type.
      doing = DoingType;
    } else if (args[i] == "OPTIONAL") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Mark the rule as optional.
      optional = true;
      doing = DoingNone;
    } else if (args[i] == "MESSAGE_NEVER") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Mark the rule as quiet.
      message_never = true;
      doing = DoingNone;
    } else if (args[i] == "PATTERN") {
      // Switch to a new pattern match rule.
      doing = DoingPattern;
      in_match_mode = true;
    } else if (args[i] == "REGEX") {
      // Switch to a new regex match rule.
      doing = DoingRegex;
      in_match_mode = true;
    } else if (args[i] == "EXCLUDE") {
      // Add this property to the current match rule.
      if (!in_match_mode || doing == DoingPattern || doing == DoingRegex) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" before a PATTERN or REGEX is given.";
        this->SetError(e.str());
        return false;
      }
      literal_args += " EXCLUDE";
      doing = DoingNone;
    } else if (args[i] == "PERMISSIONS") {
      if (!in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" before a PATTERN or REGEX is given.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the current match permissions property.
      literal_args += " PERMISSIONS";
      doing = DoingPermsMatch;
    } else if (args[i] == "FILE_PERMISSIONS") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the file permissions property.
      doing = DoingPermsFile;
    } else if (args[i] == "DIRECTORY_PERMISSIONS") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the directory permissions property.
      doing = DoingPermsDir;
    } else if (args[i] == "USE_SOURCE_PERMISSIONS") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Add this option literally.
      literal_args += " USE_SOURCE_PERMISSIONS";
      doing = DoingNone;
    } else if (args[i] == "FILES_MATCHING") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Add this option literally.
      literal_args += " FILES_MATCHING";
      doing = DoingNone;
    } else if (args[i] == "CONFIGURATIONS") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the configurations property.
      doing = DoingConfigurations;
    } else if (args[i] == "COMPONENT") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }

      // Switch to setting the component property.
      doing = DoingComponent;
    } else if (args[i] == "EXCLUDE_FROM_ALL") {
      if (in_match_mode) {
        std::ostringstream e;
        e << args[0] << " does not allow \"" << args[i]
          << "\" after PATTERN or REGEX.";
        this->SetError(e.str());
        return false;
      }
      exclude_from_all = true;
      doing = DoingNone;
    } else if (doing == DoingDirs) {
      // Convert this directory to a full path.
      std::string dir = args[i];
      std::string::size_type gpos = cmGeneratorExpression::Find(dir);
      if (gpos != 0 && !cmSystemTools::FileIsFullPath(dir)) {
        dir = this->Makefile->GetCurrentSourceDirectory();
        dir += "/";
        dir += args[i];
      }

      // Make sure the name is a directory.
      if (cmSystemTools::FileExists(dir) &&
          !cmSystemTools::FileIsDirectory(dir)) {
        std::ostringstream e;
        e << args[0] << " given non-directory \"" << args[i]
          << "\" to install.";
        this->SetError(e.str());
        return false;
      }

      // Store the directory for installation.
      dirs.push_back(std::move(dir));
    } else if (doing == DoingConfigurations) {
      configurations.push_back(args[i]);
    } else if (doing == DoingDestination) {
      destination = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingType) {
      if (allowedTypes.count(args[i]) == 0) {
        std::ostringstream e;
        e << args[0] << " given non-type \"" << args[i]
          << "\" with TYPE argument.";
        this->SetError(e.str());
        return false;
      }

      type = args[i];
      doing = DoingNone;
    } else if (doing == DoingPattern) {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      literal_args += " REGEX \"/";
      std::string regex = cmsys::Glob::PatternToRegex(args[i], false);
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "$\"";
      doing = DoingNone;
    } else if (doing == DoingRegex) {
      literal_args += " REGEX \"";
// Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__) || defined(__CYGWIN__)
      std::string regex = cmSystemTools::LowerCase(args[i]);
#else
      std::string regex = args[i];
#endif
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "\"";
      doing = DoingNone;
    } else if (doing == DoingComponent) {
      component = args[i];
      doing = DoingNone;
    } else if (doing == DoingPermsFile) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       permissions_file)) {
        std::ostringstream e;
        e << args[0] << " given invalid file permission \"" << args[i]
          << "\".";
        this->SetError(e.str());
        return false;
      }
    } else if (doing == DoingPermsDir) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       permissions_dir)) {
        std::ostringstream e;
        e << args[0] << " given invalid directory permission \"" << args[i]
          << "\".";
        this->SetError(e.str());
        return false;
      }
    } else if (doing == DoingPermsMatch) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       literal_args)) {
        std::ostringstream e;
        e << args[0] << " given invalid permission \"" << args[i] << "\".";
        this->SetError(e.str());
        return false;
      }
    } else {
      // Unknown argument.
      std::ostringstream e;
      e << args[0] << " given unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
    }
  }

  // Support installing an empty directory.
  if (dirs.empty() && destination) {
    dirs.emplace_back();
  }

  // Check if there is something to do.
  if (dirs.empty()) {
    return true;
  }
  std::string destinationStr;
  if (!destination) {
    if (type.empty()) {
      // A destination is required.
      std::ostringstream e;
      e << args[0] << " given no DESTINATION!";
      this->SetError(e.str());
      return false;
    }
    destinationStr = this->GetDestinationForType(nullptr, type);
    destination = destinationStr.c_str();
  } else if (!type.empty()) {
    std::ostringstream e;
    e << args[0]
      << " given both TYPE and DESTINATION arguments. You may only specify "
         "one.";
    this->SetError(e.str());
    return false;
  }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile, message_never);

  // Create the directory install generator.
  this->Makefile->AddInstallGenerator(new cmInstallDirectoryGenerator(
    dirs, destination, permissions_file.c_str(), permissions_dir.c_str(),
    configurations, component.c_str(), message, exclude_from_all,
    literal_args.c_str(), optional));

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}